

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RndFun.cpp
# Opt level: O0

void pad(Sarray *state,int StartIndex)

{
  int iVar1;
  undefined4 local_1c;
  int t;
  int toInsert;
  int StartIndex_local;
  Sarray *state_local;
  
  iVar1 = BitRate / 8 - StartIndex;
  if (iVar1 == 1) {
    Absorb(-0x7a,state,StartIndex);
  }
  else {
    Absorb('\x06',state,StartIndex);
    for (local_1c = 1; local_1c < iVar1 + -1; local_1c = local_1c + 1) {
      Absorb('\0',state,StartIndex + local_1c);
    }
    Absorb(-0x80,state,StartIndex + iVar1 + -1);
  }
  return;
}

Assistant:

void pad(Sarray &state, int StartIndex){
    int toInsert = (BitRate/8)-StartIndex;
    if(toInsert == 1){
        Absorb(0b10000110, state, StartIndex);
    }else{
        Absorb(0b00000110, state, StartIndex);
        for(int t = 1; t < toInsert-1; t++){
            Absorb(0b00000000, state, StartIndex+t);
        }
        Absorb(0b10000000, state, StartIndex+toInsert-1);
    }
}